

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_evaluateSolutionReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,Result simplificationStatus)

{
  ostream *poVar1;
  Real RVar2;
  char cVar3;
  Status SVar4;
  int iVar5;
  SPxOut *pSVar6;
  Verbosity old_verbosity;
  Verbosity VVar7;
  bool bVar8;
  cpp_dec_float<50U,_int,_void> local_98;
  cpp_dec_float<50U,_int,_void> local_58;
  
  if (simplificationStatus - INFEASIBLE < 3) {
    this->_hasBasis = false;
    if (this->_currentSettings->_boolParamValues[0xb] != true) {
      SVar4 = INFEASIBLE;
      if (simplificationStatus != INFEASIBLE) {
        SVar4 = (uint)(simplificationStatus != UNBOUNDED) * 2 + UNBOUNDED;
      }
      this->_status = SVar4;
      _loadRealLP(this,false);
      return;
    }
    VVar7 = (this->spxout).m_verbosity;
    if ((int)VVar7 < 3) goto LAB_003500b4;
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3],
               "simplifier detected infeasibility or unboundedness - solve again without simplifying"
               ,0x54);
    poVar1 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar3 = (char)poVar1;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
LAB_003500b1:
    (this->spxout).m_verbosity = VVar7;
LAB_003500b4:
    _preprocessAndSolveReal(this,false,(bool *)0x0);
    return;
  }
  if (simplificationStatus == OKAY) {
    SVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::status(&this->_solver);
    this->_status = SVar4;
  }
  else if (simplificationStatus == VANISHED) {
    this->_status = OPTIMAL;
    _storeSolutionRealFromPresol(this);
    return;
  }
  switch(this->_status) {
  case OPTIMAL:
    _storeSolutionReal(this,(bool)((~this->_isRealLPLoaded | this->_isRealLPScaled) & 1));
    if (this->_applyPolishing != true) {
      return;
    }
    setIntParam(this,SOLUTION_POLISHING,this->_currentSettings->_intParamValues[0x17],true);
    goto LAB_003500b4;
  case UNBOUNDED:
  case INFEASIBLE:
  case INForUNBD:
    if ((this->_isRealLPLoaded == false) && (this->_currentSettings->_boolParamValues[0xb] == true))
    {
      VVar7 = (this->spxout).m_verbosity;
      if (2 < (int)VVar7) {
        (this->spxout).m_verbosity = INFO1;
        pSVar6 = soplex::operator<<(&this->spxout," --- loading original problem");
        std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
        (this->spxout).m_verbosity = VVar7;
      }
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)
                 &(this->_solver).
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .offset,this->_currentSettings->_realParamValues[0x17]);
      _resolveWithoutPreprocessing(this,simplificationStatus);
      return;
    }
    bVar8 = false;
LAB_0035030a:
    _storeSolutionReal(this,bVar8);
    return;
  case ABORT_CYCLING:
    if ((this->_isRealLPLoaded != true) || (this->_isRealLPScaled == true)) {
      VVar7 = (this->spxout).m_verbosity;
      if (2 < (int)VVar7) {
        (this->spxout).m_verbosity = INFO1;
        pSVar6 = soplex::operator<<(&this->spxout,
                                    "encountered cycling - trying to solve again without simplifying"
                                   );
        std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
        (this->spxout).m_verbosity = VVar7;
      }
      bVar8 = true;
      goto LAB_0035030a;
    }
    if (((this->_solReal).field_0xc8 & 5) != 0) {
      this->_status = OPTIMAL_UNSCALED_VIOLATIONS;
    }
  case ABORT_TIME:
  case ABORT_ITER:
  case REGULAR:
  case RUNNING:
    local_98.data._M_elems._32_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 8);
    local_98.data._M_elems._0_8_ = *(undefined8 *)(this->_solver).theShift.m_backend.data._M_elems;
    local_98.data._M_elems._8_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 2);
    local_98.data._M_elems._16_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 4);
    local_98.data._M_elems._24_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 6);
    local_98.exp = (this->_solver).theShift.m_backend.exp;
    local_98.neg = (this->_solver).theShift.m_backend.neg;
    local_98.fpclass = (this->_solver).theShift.m_backend.fpclass;
    local_98.prec_elem = (this->_solver).theShift.m_backend.prec_elem;
    RVar2 = Tolerances::epsilon((this->_solver).
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    local_58.fpclass = cpp_dec_float_finite;
    local_58.prec_elem = 10;
    local_58.data._M_elems[0] = 0;
    local_58.data._M_elems[1] = 0;
    local_58.data._M_elems[2] = 0;
    local_58.data._M_elems[3] = 0;
    local_58.data._M_elems[4] = 0;
    local_58.data._M_elems[5] = 0;
    local_58.data._M_elems._24_5_ = 0;
    local_58.data._M_elems[7]._1_3_ = 0;
    local_58.data._M_elems._32_5_ = 0;
    local_58._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_58,RVar2);
    if (((local_98.fpclass != cpp_dec_float_NaN) && (local_58.fpclass != cpp_dec_float_NaN)) &&
       (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_98,&local_58), 0 < iVar5)) {
      if ((this->_solver).m_status == OPTIMAL) {
        (this->_solver).m_status = UNKNOWN;
      }
      if ((this->_solver).
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .thestatus != REGULAR) {
        (this->_solver).
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .thestatus = REGULAR;
      }
    }
    bVar8 = false;
LAB_0035021d:
    _storeSolutionReal(this,bVar8);
    break;
  case ABORT_VALUE:
    local_98.data._M_elems._32_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 8);
    local_98.data._M_elems._0_8_ = *(undefined8 *)(this->_solver).theShift.m_backend.data._M_elems;
    local_98.data._M_elems._8_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 2);
    local_98.data._M_elems._16_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 4);
    local_98.data._M_elems._24_8_ =
         *(undefined8 *)((this->_solver).theShift.m_backend.data._M_elems + 6);
    local_98.exp = (this->_solver).theShift.m_backend.exp;
    local_98.neg = (this->_solver).theShift.m_backend.neg;
    local_98.fpclass = (this->_solver).theShift.m_backend.fpclass;
    local_98.prec_elem = (this->_solver).theShift.m_backend.prec_elem;
    RVar2 = Tolerances::epsilon((this->_solver).
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    local_58.fpclass = cpp_dec_float_finite;
    local_58.prec_elem = 10;
    local_58.data._M_elems[0] = 0;
    local_58.data._M_elems[1] = 0;
    local_58.data._M_elems[2] = 0;
    local_58.data._M_elems[3] = 0;
    local_58.data._M_elems[4] = 0;
    local_58.data._M_elems[5] = 0;
    local_58.data._M_elems._24_5_ = 0;
    local_58.data._M_elems[7]._1_3_ = 0;
    local_58.data._M_elems._32_5_ = 0;
    local_58._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_58,RVar2);
    if (((local_98.fpclass != cpp_dec_float_NaN) && (local_58.fpclass != cpp_dec_float_NaN)) &&
       (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_98,&local_58), 0 < iVar5)) {
      if ((this->_solver).m_status == OPTIMAL) {
        (this->_solver).m_status = UNKNOWN;
      }
      if ((this->_solver).
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .thestatus != REGULAR) {
        (this->_solver).
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .thestatus = REGULAR;
      }
    }
    bVar8 = true;
    goto LAB_0035021d;
  case SINGULAR:
    if (this->_isRealLPLoaded == false) {
      VVar7 = (this->spxout).m_verbosity;
      if ((int)VVar7 < 3) goto LAB_003500b4;
      (this->spxout).m_verbosity = INFO1;
      pSVar6 = soplex::operator<<(&this->spxout,
                                  "encountered singularity - trying to solve again without simplifying"
                                 );
      std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
      goto LAB_003500b1;
    }
  default:
    this->_hasBasis = false;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_evaluateSolutionReal(typename SPxSimplifier<R>::Result simplificationStatus)
{
   // if the simplifier detected infeasibility or unboundedness we optimize again
   // just to get the proof (primal or dual ray)
   // todo get infeasibility proof from simplifier
   switch(simplificationStatus)
   {
   case SPxSimplifier<R>::INFEASIBLE:
   case SPxSimplifier<R>::DUAL_INFEASIBLE:
   case SPxSimplifier<R>::UNBOUNDED:
      _hasBasis = false;

      if(boolParam(SoPlexBase<R>::ENSURERAY))
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "simplifier detected infeasibility or unboundedness - solve again without simplifying" << std::endl;
                      )
         _preprocessAndSolveReal(false);
      }
      else
      {
         if(simplificationStatus == SPxSimplifier<R>::INFEASIBLE)
            _status = SPxSolverBase<R>::INFEASIBLE;
         else if(simplificationStatus == SPxSimplifier<R>::UNBOUNDED)
            _status = SPxSolverBase<R>::UNBOUNDED;
         else
            _status = SPxSolverBase<R>::INForUNBD;

         // load original LP to restore clean solver state
         _loadRealLP(false);
      }

      return;

   case SPxSimplifier<R>::VANISHED:
      _status = SPxSolverBase<R>::OPTIMAL;
      _storeSolutionRealFromPresol();
      return;

   case SPxSimplifier<R>::OKAY:
      _status = _solver.status();
   }

   // process result
   switch(_status)
   {
   case SPxSolverBase<R>::OPTIMAL:
      _storeSolutionReal(!_isRealLPLoaded || _isRealLPScaled);

      // apply polishing on original problem
      if(_applyPolishing)
      {
         int polishing = intParam(SoPlexBase<R>::SOLUTION_POLISHING);
         setIntParam(SoPlexBase<R>::SOLUTION_POLISHING, polishing);
         _preprocessAndSolveReal(false);
      }

      break;

   case SPxSolverBase<R>::UNBOUNDED:
   case SPxSolverBase<R>::INFEASIBLE:
   case SPxSolverBase<R>::INForUNBD:

      // in case of infeasibility or unboundedness, we currently can not unsimplify, but have to solve the original LP again
      if(!_isRealLPLoaded && boolParam(SoPlexBase<R>::ENSURERAY))
      {
         SPX_MSG_INFO1(spxout, spxout << " --- loading original problem" << std::endl;)
         _solver.changeObjOffset(realParam(SoPlexBase<R>::OBJ_OFFSET));
         // we cannot do more to remove violations
         _resolveWithoutPreprocessing(simplificationStatus);
      }
      else
      {
         _storeSolutionReal(false);
      }

      break;

   case SPxSolverBase<R>::SINGULAR:

      // if preprocessing was applied, try to run again without to avoid singularity
      if(!_isRealLPLoaded)
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "encountered singularity - trying to solve again without simplifying" <<
                       std::endl;)
         _preprocessAndSolveReal(false);
         return;
      }

      _hasBasis = false;
      break;

   case SPxSolverBase<R>::ABORT_VALUE:

      // If we aborted the solve for some reason and there is still a shift, ensure that the basis status is correct
      if(_solver.shift() > _solver.epsilon())
         _solver.setBasisStatus(SPxBasisBase<R>::REGULAR);

      _storeSolutionReal(true);
      break;

   case SPxSolverBase<R>::ABORT_CYCLING:

      // if preprocessing or scaling was applied, try to run again without to
      // avoid cycling
      if(!_isRealLPLoaded || _isRealLPScaled)
      {
         SPX_MSG_INFO1(spxout, spxout << "encountered cycling - trying to solve again without simplifying" <<
                       std::endl;)
         // store and unsimplify sub-optimal solution and basis, may trigger re-solve
         _storeSolutionReal(true);
         return;
      }

      if(_solReal.isPrimalFeasible() || _solReal.isDualFeasible())
         _status = SPxSolverBase<R>::OPTIMAL_UNSCALED_VIOLATIONS;

   // FALLTHROUGH
   case SPxSolverBase<R>::ABORT_TIME:
   case SPxSolverBase<R>::ABORT_ITER:
   case SPxSolverBase<R>::REGULAR:
   case SPxSolverBase<R>::RUNNING:

      // If we aborted the solve for some reason and there is still a shift, ensure that the basis status is correct
      if(_solver.shift() > _solver.epsilon())
         _solver.setBasisStatus(SPxBasisBase<R>::REGULAR);

      _storeSolutionReal(false);
      break;

   default:
      _hasBasis = false;
      break;
   }
}